

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinatorProcessing.cpp
# Opt level: O2

tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> __thiscall
helics::processCoordinatorMessage
          (helics *this,ActionMessage *cmd,TimeCoordinator *timeCoord,FederateStates state,
          bool timeGranted_mode,GlobalFederateId localID)

{
  ushort uVar1;
  action_t aVar2;
  helics hVar3;
  helics hVar4;
  helics hVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  GlobalFederateId triggerFed;
  ulong uVar9;
  hash<std::thread::id> local_39;
  id local_38;
  
  aVar2 = cmd->messageAction;
  hVar5 = (helics)0xfe;
  switch(aVar2) {
  case cmd_disconnect:
  case cmd_disconnect_fed:
    if ((cmd->source_id).gid == localID.gid) {
      if ((state == TERMINATING) || (state == FINISHED)) break;
      BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
      (cmd->dest_id).gid = 0;
      state = TERMINATING;
      goto LAB_002f4360;
    }
    iVar6 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if (state != EXECUTING || timeGranted_mode) {
      hVar5 = (helics)((char)iVar6 == '\x05' | CONTINUE_PROCESSING);
      break;
    }
    goto LAB_002f44a8;
  case cmd_disconnect_name:
  case cmd_disconnect_check:
  case cmd_init:
  case cmd_init_not_ready:
  case cmd_init_not_ready|cmd_tick:
  case cmd_init_not_ready|cmd_user_disconnect:
  case cmd_init_not_ready|cmd_disconnect:
  case ~(cmd_add_route|cmd_init_not_ready|cmd_disconnect):
  case ~(cmd_add_route|cmd_init_not_ready|cmd_user_disconnect):
  case ~(cmd_add_route|cmd_init_not_ready|cmd_tick):
  case ~(cmd_add_route|cmd_init_not_ready):
  case cmd_exec_request|cmd_tick:
  case cmd_exec_grant|cmd_tick:
  case cmd_exec_check|cmd_tick:
  case cmd_exec_check|cmd_user_disconnect:
  case cmd_exec_check|cmd_disconnect:
  case cmd_exec_check|cmd_disconnect_name:
  case cmd_exec_check|cmd_disconnect_check:
  case 0x20:
  case 0x21:
  case 0x22:
  case cmd_time_check|cmd_tick:
  case cmd_request_current_time|cmd_tick:
  case cmd_time_barrier_request:
    break;
  case cmd_init_grant:
    if (state == CREATED) {
      uVar1 = cmd->flags;
      if ((uVar1 & 0x300) != 0) {
        timeCoord->dynamicJoining = true;
      }
      if ((uVar1 & 1) == 0) {
        timeGranted_mode = true;
        hVar5 = (helics)0x0;
        state = INITIALIZING;
      }
      else {
        hVar5 = (helics)0x2;
        timeGranted_mode = false;
        state = CREATED;
      }
    }
    break;
  case cmd_exec_request:
    if (((cmd->source_id).gid == localID.gid) && (uVar1 = cmd->flags, (uVar1 & 0x20) != 0)) {
      timeGranted_mode = false;
      uVar7 = (uint)(byte)(((uVar1 & 4) == 0) + 1);
      if ((uVar1 & 1) == 0) {
        uVar7 = uVar1 & 1;
      }
      (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[10])
                (timeCoord,(ulong)uVar7);
      break;
    }
  case cmd_exec_grant:
    uVar7 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if ((char)uVar7 != '\x05') {
      if ((uVar7 & 0xff) != 0) {
switchD_002f41c0_caseD_18:
        if (state == INITIALIZING && !timeGranted_mode) {
          uVar9 = 0x8831d580;
          if (cmd->messageAction == cmd_exec_request) {
            uVar9 = (ulong)(uint)(cmd->source_id).gid;
          }
          uVar7 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[9])
                            (timeCoord,uVar9);
          state = INITIALIZING;
          hVar4 = SUB41(uVar7,0);
          if (hVar4 == (helics)0xfe) {
            if ((cmd->messageAction == cmd_exec_grant) && ((cmd->flags & 1) == 0)) {
              TimeCoordinator::sendUpdatedExecRequest
                        (timeCoord,(GlobalFederateId)0x8831d580,(GlobalFederateId)0x8831d580,0);
            }
          }
          else {
            hVar3 = (helics)0x1;
            hVar5 = hVar4;
            if ((uVar7 & 0xff) == 0) {
              hVar3 = (helics)0x2;
            }
LAB_002f4548:
            state = (FederateStates)hVar3;
            timeGranted_mode = true;
          }
        }
      }
      break;
    }
    goto LAB_002f4445;
  case cmd_exec_check:
    goto switchD_002f41c0_caseD_18;
  case cmd_stop:
    BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
  case cmd_terminate_immediately:
    state = FINISHED;
    hVar5 = (helics)0x3;
    break;
  case cmd_time_grant:
switchD_002f41c0_caseD_23:
    uVar7 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if ((char)uVar7 != '\x05') {
      if ((uVar7 & 0xff) == 0) break;
      goto switchD_002f41c0_caseD_24;
    }
    goto LAB_002f4445;
  case cmd_time_check:
switchD_002f41c0_caseD_24:
    if (state != EXECUTING) goto LAB_002f4345;
    state = EXECUTING;
    hVar3 = (helics)0x2;
    hVar5 = (helics)0xfe;
    if (!timeGranted_mode) {
      triggerFed.gid = -2010000000;
      if (cmd->messageAction == cmd_time_request) {
        triggerFed.gid = (cmd->source_id).gid;
      }
      hVar5 = (helics)TimeCoordinator::checkTimeGrant(timeCoord,triggerFed);
      timeGranted_mode = (bool)((byte)~(byte)hVar5 >> 7);
      break;
    }
    goto LAB_002f4548;
  case cmd_request_current_time:
switchD_002f41c0_caseD_26:
    (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    break;
  case cmd_time_block:
  case cmd_time_unblock:
  case cmd_time_barrier:
  case cmd_time_barrier_clear:
    iVar6 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if ((char)iVar6 == '\0' || timeGranted_mode) break;
    if (state == EXECUTING) {
      ActionMessage::setAction(cmd,cmd_time_check);
      state = EXECUTING;
      goto LAB_002f4360;
    }
LAB_002f4345:
    if (state != INITIALIZING) break;
    ActionMessage::setAction(cmd,cmd_exec_check);
    state = INITIALIZING;
LAB_002f4360:
    hVar5 = (helics)0x8;
    break;
  default:
    if (((uint)(aVar2 + ~(cmd_remove_publication|cmd_disconnect)) < 10) &&
       ((0x333U >> (aVar2 + ~(cmd_remove_publication|cmd_disconnect) & 0x1fU) & 1) != 0)) {
      if ((cmd->dest_id).gid == localID.gid) {
        BaseTimeCoordinator::processDependencyUpdateMessage
                  (&timeCoord->super_BaseTimeCoordinator,cmd);
      }
      break;
    }
    if ((5 < (uint)(aVar2 + 0xffffd8f0)) || ((0x29U >> (aVar2 + 0xffffd8f0 & 0x1fU) & 1) == 0)) {
      if (aVar2 == cmd_timing_info) goto switchD_002f41c0_caseD_26;
      if (aVar2 != cmd_time_request) {
        if (aVar2 == cmd_force_time_grant) {
          if ((timeCoord->time_granted).internalTimeCode <= (cmd->actionTime).internalTimeCode) {
            (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
            timeGranted_mode = true;
            hVar5 = (helics)0x0;
          }
        }
        else if (aVar2 == cmd_disconnect_fed_ack) {
          if (((cmd->dest_id).gid == localID.gid) && ((cmd->source_id).gid == 0)) {
            hVar5 = (helics)0x3;
            if ((state != TERMINATING) && (state != FINISHED)) {
              BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
            }
            state = FINISHED;
          }
        }
        else if (aVar2 == cmd_user_return) {
          local_38._M_thread = pthread_self();
          sVar8 = std::hash<std::thread::id>::operator()(&local_39,&local_38);
          hVar5 = (helics)0xfe;
          if (cmd->messageID == (int)sVar8) {
            hVar5 = (helics)0x5;
          }
        }
        break;
      }
      goto switchD_002f41c0_caseD_23;
    }
    if ((aVar2 == cmd_global_error) ||
       (((uVar7 = (cmd->source_id).gid, uVar7 == localID.gid || (uVar7 < 2)) ||
        ((cmd->dest_id).gid != localID.gid)))) {
      if ((state != TERMINATING) && (state != FINISHED)) {
        state = ERRORED;
        hVar5 = (helics)0x7;
        if (aVar2 != cmd_global_error) {
          TimeCoordinator::localError(timeCoord);
        }
      }
      break;
    }
  case cmd_broadcast_disconnect:
  case cmd_disconnect_core:
  case cmd_disconnect_broker:
    uVar7 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if ((char)uVar7 == '\x05') {
LAB_002f4445:
      hVar5 = (helics)0xff;
    }
    else if (((uVar7 & 0xff) != 0) && (state == EXECUTING && !timeGranted_mode)) {
LAB_002f44a8:
      hVar5 = (helics)TimeCoordinator::checkTimeGrant(timeCoord,(GlobalFederateId)0x8831d580);
      hVar3 = (helics)0x1;
      if ((char)hVar5 < NEXT_STEP) {
        hVar3 = (helics)timeGranted_mode;
      }
      timeGranted_mode = (bool)hVar3;
      state = EXECUTING;
    }
  }
  *this = (helics)timeGranted_mode;
  this[1] = hVar5;
  this[2] = (helics)state;
  return (tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool>)SUB83(this,0);
}

Assistant:

std::tuple<FederateStates, MessageProcessingResult, bool>
    processCoordinatorMessage(ActionMessage& cmd,
                              TimeCoordinator* timeCoord,
                              const FederateStates state,
                              const bool timeGranted_mode,
                              const GlobalFederateId localID)
{
    FederateStates newState{state};
    bool newMode{timeGranted_mode};
    MessageProcessingResult proc{MessageProcessingResult::CONTINUE_PROCESSING};
    bool returnable{false};
    switch (cmd.action()) {
        case CMD_IGNORE:
        default:
            break;
        case CMD_USER_RETURN: {
            auto tidHash = std::hash<std::thread::id>{}(std::this_thread::get_id());
            auto tid = static_cast<std::int32_t>(tidHash);
            if (tid == cmd.messageID) {
                proc = MessageProcessingResult::USER_RETURN;
            }

        } break;
        case CMD_TIME_BLOCK:
        case CMD_TIME_BARRIER:
        case CMD_TIME_BARRIER_CLEAR:
        case CMD_TIME_UNBLOCK: {
            auto processed = timeCoord->processTimeMessage(cmd);
            if (processed != TimeProcessingResult::NOT_PROCESSED) {
                if (!timeGranted_mode) {
                    if (state == FederateStates::INITIALIZING) {
                        cmd.setAction(CMD_EXEC_CHECK);
                        proc = MessageProcessingResult::REPROCESS_MESSAGE;
                    }
                    if (state == FederateStates::EXECUTING) {
                        cmd.setAction(CMD_TIME_CHECK);
                        proc = MessageProcessingResult::REPROCESS_MESSAGE;
                    }
                }
            }
            break;
        }
        case CMD_INIT_GRANT:
            if (state == FederateStates::CREATED) {
                if (checkActionFlag(cmd, observer_flag) ||
                    checkActionFlag(cmd, dynamic_join_flag)) {
                    timeCoord->setDynamicJoining();
                }
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    newState = FederateStates::CREATED;
                    newMode = false;
                    proc = MessageProcessingResult::ITERATING;
                } else {
                    newState = FederateStates::INITIALIZING;
                    newMode = true;
                    proc = MessageProcessingResult::NEXT_STEP;
                }
            }
            break;
        case CMD_EXEC_REQUEST:
            if ((cmd.source_id == localID) &&
                checkActionFlag(cmd, indicator_flag)) {  // this sets up a time request
                IterationRequest iterate = IterationRequest::NO_ITERATIONS;
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    iterate = (checkActionFlag(cmd, required_flag)) ?
                        IterationRequest::FORCE_ITERATION :
                        IterationRequest::ITERATE_IF_NEEDED;
                }
                timeCoord->enteringExecMode(iterate);
                newMode = false;
                break;
            }
            [[fallthrough]];
        case CMD_EXEC_GRANT: {
            bool processed = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    processed = true;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    processed = true;
                    break;
                default:
                    break;
            }
            if (processed) {
                break;
            }
        }
            [[fallthrough]];
        case CMD_EXEC_CHECK:  // just check the time for entry
        {
            if (state != FederateStates::INITIALIZING) {
                break;
            }
            if (!timeGranted_mode) {
                auto grant = timeCoord->checkExecEntry(
                    cmd.action() == CMD_EXEC_REQUEST ? cmd.source_id : GlobalFederateId{});
                switch (grant) {
                    case MessageProcessingResult::ITERATING:
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                    case MessageProcessingResult::NEXT_STEP:
                        newState = FederateStates::EXECUTING;
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                    case MessageProcessingResult::CONTINUE_PROCESSING:
                        if (cmd.action() == CMD_EXEC_GRANT &&
                            !checkActionFlag(cmd, iteration_requested_flag)) {
                            timeCoord->sendUpdatedExecRequest();
                        }
                        break;
                    default:
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                }
            }
        } break;
        case CMD_TERMINATE_IMMEDIATELY:
            newState = FederateStates::FINISHED;
            proc = MessageProcessingResult::HALTED;
            break;
        case CMD_STOP:
            newState = FederateStates::FINISHED;
            timeCoord->disconnect();
            proc = MessageProcessingResult::HALTED;
            break;
        case CMD_DISCONNECT_FED_ACK:
            if ((cmd.dest_id == localID) && (cmd.source_id == parent_broker_id)) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    timeCoord->disconnect();
                }
                newState = FederateStates::FINISHED;
                proc = MessageProcessingResult::HALTED;
            }
            break;
        case CMD_REQUEST_CURRENT_TIME:
        case CMD_TIMING_INFO:
            timeCoord->processTimeMessage(cmd);
            break;
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT:
            if (cmd.source_id == localID) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    timeCoord->disconnect();
                    cmd.dest_id = parent_broker_id;
                    newState = FederateStates::TERMINATING;
                    proc = MessageProcessingResult::REPROCESS_MESSAGE;
                }
            } else {
                // returnable = false;
                switch (timeCoord->processTimeMessage(cmd)) {
                    case TimeProcessingResult::DELAY_PROCESSING:
                        // returnable = true;
                        proc = MessageProcessingResult::DELAY_MESSAGE;
                        break;
                    case TimeProcessingResult::NOT_PROCESSED:
                        // returnable = true;
                        proc = MessageProcessingResult::CONTINUE_PROCESSING;
                        break;
                    default:
                        break;
                }
                if (state != FederateStates::EXECUTING) {
                    break;
                }
                if (!timeGranted_mode) {
                    proc = timeCoord->checkTimeGrant();
                    if (returnableResult(proc)) {
                        newMode = true;
                    }
                }
            }
            break;
        case CMD_BROADCAST_DISCONNECT:
        case CMD_DISCONNECT_BROKER:
        case CMD_DISCONNECT_CORE:
            returnable = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    returnable = true;
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    returnable = true;
                    break;
                default:
                    break;
            }
            if (returnable) {
                break;
            }
            if (state != FederateStates::EXECUTING) {
                break;
            }
            if (!timeGranted_mode) {
                proc = timeCoord->checkTimeGrant();
                if (returnableResult(proc)) {
                    newMode = true;
                }
            }
            break;

        case CMD_TIME_REQUEST:
        case CMD_TIME_GRANT:
            returnable = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    returnable = true;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    returnable = true;
                    break;
                default:
                    break;
            }
            if (returnable) {
                break;
            }
            [[fallthrough]];
        case CMD_TIME_CHECK:
            if (state != FederateStates::EXECUTING) {
                if (state == FederateStates::INITIALIZING) {
                    cmd.setAction(CMD_EXEC_CHECK);
                    proc = MessageProcessingResult::REPROCESS_MESSAGE;
                }

                break;
            }
            if (!timeGranted_mode) {
                proc = timeCoord->checkTimeGrant(
                    cmd.action() == CMD_TIME_REQUEST ? cmd.source_id : GlobalFederateId{});
                if (returnableResult(proc)) {
                    newMode = true;
                }
            }
            break;
        case CMD_FORCE_TIME_GRANT: {
            if (cmd.actionTime < timeCoord->getGrantedTime()) {
                break;
            }
            timeCoord->processTimeMessage(cmd);
            newMode = true;
            proc = MessageProcessingResult::NEXT_STEP;
            break;
        }

        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
        case CMD_GLOBAL_ERROR:
            if (cmd.action() == CMD_GLOBAL_ERROR || cmd.source_id == localID ||
                cmd.source_id == parent_broker_id || cmd.source_id == gRootBrokerID ||
                cmd.dest_id != localID) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    if (cmd.action() != CMD_GLOBAL_ERROR) {
                        timeCoord->localError();
                    }
                    newState = FederateStates::ERRORED;
                    proc = MessageProcessingResult::ERROR_RESULT;
                }
            } else {
                switch (timeCoord->processTimeMessage(cmd)) {
                    case TimeProcessingResult::DELAY_PROCESSING:
                        returnable = true;
                        proc = MessageProcessingResult::DELAY_MESSAGE;
                        break;
                    case TimeProcessingResult::NOT_PROCESSED:
                        returnable = true;
                        proc = MessageProcessingResult::CONTINUE_PROCESSING;
                        break;
                    default:
                        break;
                }
                if (state != FederateStates::EXECUTING) {
                    break;
                }
                if (returnable) {
                    break;
                }
                if (!timeGranted_mode) {
                    proc = timeCoord->checkTimeGrant();
                    if (returnableResult(proc)) {
                        newMode = true;
                    }
                }
            }
            break;
        case CMD_ADD_DEPENDENCY:
        case CMD_REMOVE_DEPENDENCY:
        case CMD_ADD_DEPENDENT:
        case CMD_REMOVE_DEPENDENT:
        case CMD_ADD_INTERDEPENDENCY:
        case CMD_REMOVE_INTERDEPENDENCY:
            if (cmd.dest_id == localID) {
                timeCoord->processDependencyUpdateMessage(cmd);
            }

            break;
    }
    return {newState, proc, newMode};
}